

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  ArrayIndex AVar1;
  ArrayIndex index;
  Value VStack_48;
  
  if (this->field_0x8 == '\0') {
    Value(&VStack_48,arrayValue);
    operator=(this,&VStack_48);
    ~Value(&VStack_48);
  }
  else if (this->field_0x8 != '\x06') {
    __assert_fail("type_ == nullValue || type_ == arrayValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                  ,0x41b,"void Json::Value::resize(ArrayIndex)");
  }
  AVar1 = size(this);
  if (newSize == 0) {
    clear(this);
  }
  else {
    index = newSize;
    if (AVar1 < newSize) {
      operator[](this,newSize - 1);
    }
    else {
      for (; AVar1 != index; index = index + 1) {
        this_00 = &((this->value_).map_)->_M_t;
        CZString::CZString((CZString *)&VStack_48,index);
        std::
        _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::erase(this_00,(key_type *)&VStack_48);
        CZString::~CZString((CZString *)&VStack_48);
      }
      AVar1 = size(this);
      if (AVar1 != newSize) {
        __assert_fail("size() == newSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                      ,0x42a,"void Json::Value::resize(ArrayIndex)");
      }
    }
  }
  return;
}

Assistant:

void 
Value::resize( ArrayIndex newSize )
{
   JSON_ASSERT( type_ == nullValue  ||  type_ == arrayValue );
   if ( type_ == nullValue )
      *this = Value( arrayValue );
#ifndef JSON_VALUE_USE_INTERNAL_MAP
   ArrayIndex oldSize = size();
   if ( newSize == 0 )
      clear();
   else if ( newSize > oldSize )
      (*this)[ newSize - 1 ];
   else
   {
      for ( ArrayIndex index = newSize; index < oldSize; ++index )
      {
         value_.map_->erase( index );
      }
      assert( size() == newSize );
   }
#else
   value_.array_->resize( newSize );
#endif
}